

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O2

InlineWriter * __thiscall adios2::core::engine::InlineReader::GetWriter(InlineReader *this)

{
  IO *pIVar1;
  Mode MVar2;
  long lVar3;
  InlineWriter *pIVar4;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  shared_ptr<adios2::core::Engine> e;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pIVar1 = (this->super_Engine).m_IO;
  if ((pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count != 2) {
    std::__cxx11::string::string((string *)&local_30,"Engine",(allocator *)&e);
    std::__cxx11::string::string((string *)&local_50,"InlineReader",&local_a2);
    std::__cxx11::string::string((string *)&local_70,"GetWriter",&local_a3);
    std::__cxx11::string::string
              ((string *)&local_90,
               "There must be exactly one reader and one writer for the inline engine.",&local_a4);
    helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)
             ((pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2));
  MVar2 = Engine::OpenMode(e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  if (MVar2 == Read) {
    lVar3 = std::_Rb_tree_decrement
                      (&(pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header);
    std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x40));
  }
  if (e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pIVar4 = (InlineWriter *)
             __dynamic_cast(e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&Engine::typeinfo,&InlineWriter::typeinfo,0);
    if (pIVar4 != (InlineWriter *)0x0) goto LAB_004d306f;
  }
  std::__cxx11::string::string((string *)&local_30,"Engine",&local_a2);
  std::__cxx11::string::string((string *)&local_50,"InlineReader",&local_a3);
  std::__cxx11::string::string((string *)&local_70,"GetWriter",&local_a4);
  std::__cxx11::string::string
            ((string *)&local_90,"dynamic_cast<InlineWriter*> failed; this is very likely a bug.",
             &local_a1);
  helper::Throw<std::runtime_error>(&local_30,&local_50,&local_70,&local_90,-1);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pIVar4 = (InlineWriter *)0x0;
LAB_004d306f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&e.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pIVar4;
}

Assistant:

const InlineWriter *InlineReader::GetWriter() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() != 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineReader", "GetWriter",
                                          "There must be exactly one reader and one "
                                          "writer for the inline engine.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Read)
    {
        e = engine_map.rbegin()->second;
    }

    const auto writer = dynamic_cast<InlineWriter *>(e.get());
    if (!writer)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineReader", "GetWriter",
            "dynamic_cast<InlineWriter*> failed; this is very likely a bug.");
    }
    return writer;
}